

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

ostream * Kernel::operator<<(ostream *out,Clause *self)

{
  SplitSet *pSVar1;
  char *pcVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  
  if ((*(uint *)&self->field_0x38 & 0xfffff) == 0) {
    pcVar2 = "$$false";
    lVar4 = 6;
    poVar3 = out;
  }
  else {
    operator<<(out,self->_literals[0]);
    if ((*(uint *)&self->field_0x38 & 0xffffe) != 0) {
      lVar4 = 0xf;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out," | ",3);
        operator<<(out,self->_literals[lVar4 + -0xe]);
        uVar5 = lVar4 - 0xd;
        lVar4 = lVar4 + 1;
      } while (uVar5 < ((uint)*(undefined8 *)&self->field_0x38 & 0xfffff));
    }
    pSVar1 = (self->super_Unit)._inference._splits;
    if (pSVar1 == (SplitSet *)0x0) {
      return out;
    }
    if (pSVar1->_size == 0) {
      return out;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
    poVar3 = ::Lib::operator<<(out,(self->super_Unit)._inference._splits);
    pcVar2 = " }";
    lVar4 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2 + 1,lVar4);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Clause const& self)
{
  if (self.size() == 0) {
    return out << "$false";
  } else {
    out << *self[0];
    for (unsigned i = 1; i < self.size(); i++){
      out << " | " << *self[i];
    }
    if (self.splits() && !self.splits()->isEmpty()) {
      out << "{" << *self.splits() << "}";
    }
  }
  return out;
}